

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O0

void __thiscall zmq::blob_t::set(blob_t *this,uchar *data_,size_t size_)

{
  uchar *puVar1;
  size_t in_RDX;
  void *in_RSI;
  blob_t *in_RDI;
  
  clear(in_RDI);
  puVar1 = (uchar *)malloc(in_RDX);
  in_RDI->_data = puVar1;
  if (in_RDI->_data == (uchar *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/blob.hpp"
            ,0x8e);
    fflush(_stderr);
    zmq_abort((char *)0x20d9ca);
  }
  in_RDI->_size = in_RDX;
  in_RDI->_owned = true;
  memcpy(in_RDI->_data,in_RSI,in_RDX);
  return;
}

Assistant:

void set (const unsigned char *const data_, const size_t size_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (size_));
        alloc_assert (_data);
        _size = size_;
        _owned = true;
        memcpy (_data, data_, size_);
    }